

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fruit.cpp
# Opt level: O0

ostream * L13_4::operator<<(ostream *os,Banana *b)

{
  ostream *poVar1;
  Banana *b_local;
  ostream *os_local;
  
  operator<<(os,&b->super_Fruit);
  poVar1 = std::operator<<(os,"Style: ");
  poVar1 = std::operator<<(poVar1,b->_style);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  return os;
}

Assistant:

std::ostream& operator<<(std::ostream &os, const Banana &b) {
        os << (const Fruit &) b;
        os << "Style: " << b._style << std::endl;
        return os;
    }